

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * string_from_abi_cxx11_
                   (string *__return_storage_ptr__,llama_context *ctx,
                   vector<int,_std::allocator<int>_> *tokens)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint __val;
  string *psVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined8 uVar9;
  llama_vocab *vocab;
  ostream *poVar10;
  ulong uVar11;
  _Alloc_hider _Var12;
  byte *pbVar13;
  uint *puVar14;
  long lVar15;
  byte *pbVar16;
  uint __len;
  _Alloc_hider _Var17;
  string detokenized;
  string __str;
  stringstream buf;
  string local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  string *local_1d0;
  uint *local_1c8;
  llama_context *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d0 = __return_storage_ptr__;
  local_1c0 = ctx;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[ ",2);
  puVar14 = (uint *)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  local_1c8 = (uint *)(tokens->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish;
  if (puVar14 != local_1c8) {
    bVar6 = true;
    do {
      if (!bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
      }
      uVar3 = *puVar14;
      uVar9 = llama_get_model(local_1c0);
      vocab = (llama_vocab *)llama_model_get_vocab(uVar9);
      common_token_to_piece_abi_cxx11_(&local_210,vocab,uVar3,true);
      _Var17._M_p = local_210._M_dataplus._M_p;
      pbVar1 = (byte *)(local_210._M_dataplus._M_p + local_210._M_string_length);
      _Var12._M_p = local_210._M_dataplus._M_p;
      if (0 < (long)local_210._M_string_length >> 2) {
        _Var12._M_p = local_210._M_dataplus._M_p + (local_210._M_string_length & 0xfffffffffffffffc)
        ;
        lVar15 = ((long)local_210._M_string_length >> 2) + 1;
        pbVar13 = (byte *)(local_210._M_dataplus._M_p + 3);
        do {
          iVar7 = isprint((uint)pbVar13[-3]);
          if (iVar7 == 0) {
            pbVar13 = pbVar13 + -3;
            goto LAB_001f701b;
          }
          iVar7 = isprint((uint)pbVar13[-2]);
          if (iVar7 == 0) {
            pbVar13 = pbVar13 + -2;
            goto LAB_001f701b;
          }
          iVar7 = isprint((uint)pbVar13[-1]);
          if (iVar7 == 0) {
            pbVar13 = pbVar13 + -1;
            goto LAB_001f701b;
          }
          iVar7 = isprint((uint)*pbVar13);
          if (iVar7 == 0) goto LAB_001f701b;
          lVar15 = lVar15 + -1;
          pbVar13 = pbVar13 + 4;
        } while (1 < lVar15);
      }
      lVar15 = (long)pbVar1 - (long)_Var12._M_p;
      if (lVar15 == 1) {
LAB_001f6ff8:
        iVar7 = isprint((uint)(byte)*_Var12._M_p);
        pbVar13 = (byte *)_Var12._M_p;
        if (iVar7 != 0) {
          pbVar13 = pbVar1;
        }
LAB_001f701b:
        pbVar16 = pbVar13 + 1;
        if (pbVar16 != pbVar1 && pbVar13 != pbVar1) {
          do {
            bVar2 = *pbVar16;
            iVar7 = isprint((uint)bVar2);
            if (iVar7 != 0) {
              *pbVar13 = bVar2;
              pbVar13 = pbVar13 + 1;
            }
            pbVar16 = pbVar16 + 1;
            _Var17._M_p = local_210._M_dataplus._M_p;
          } while (pbVar16 != pbVar1);
        }
      }
      else {
        if (lVar15 == 2) {
LAB_001f6fe8:
          iVar7 = isprint((uint)(byte)*_Var12._M_p);
          pbVar13 = (byte *)_Var12._M_p;
          if (iVar7 != 0) {
            _Var12._M_p = _Var12._M_p + 1;
            goto LAB_001f6ff8;
          }
          goto LAB_001f701b;
        }
        pbVar13 = pbVar1;
        if (lVar15 == 3) {
          iVar7 = isprint((uint)(byte)*_Var12._M_p);
          pbVar13 = (byte *)_Var12._M_p;
          if (iVar7 != 0) {
            _Var12._M_p = _Var12._M_p + 1;
            goto LAB_001f6fe8;
          }
          goto LAB_001f701b;
        }
      }
      local_210._M_string_length = (long)pbVar13 - (long)_Var17._M_p;
      *pbVar13 = 0;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\'",1);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,local_210._M_dataplus._M_p,local_210._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\'",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,":",1);
      uVar3 = *puVar14;
      __val = -uVar3;
      if (0 < (int)uVar3) {
        __val = uVar3;
      }
      __len = 1;
      if (9 < __val) {
        uVar11 = (ulong)__val;
        uVar5 = 4;
        do {
          __len = uVar5;
          uVar8 = (uint)uVar11;
          if (uVar8 < 100) {
            __len = __len - 2;
            goto LAB_001f7116;
          }
          if (uVar8 < 1000) {
            __len = __len - 1;
            goto LAB_001f7116;
          }
          if (uVar8 < 10000) goto LAB_001f7116;
          uVar11 = uVar11 / 10000;
          uVar5 = __len + 4;
        } while (99999 < uVar8);
        __len = __len + 1;
      }
LAB_001f7116:
      local_1f0 = local_1e0;
      std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)__len - (char)((int)uVar3 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_1f0 + (ulong)(uVar3 >> 0x1f)),__len,__val);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)local_1f0,local_1e8);
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
      }
      puVar14 = puVar14 + 1;
      bVar6 = false;
    } while (puVar14 != local_1c8);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8," ]",2);
  psVar4 = local_1d0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string string_from(const struct llama_context * ctx, const std::vector<llama_token> & tokens) {
    std::stringstream buf;

    buf << "[ ";

    bool first = true;
    for (const auto & token : tokens) {
        if (!first) {
            buf << ", ";
        } else {
            first = false;
        }

        auto detokenized = common_token_to_piece(ctx, token);

        detokenized.erase(
            std::remove_if(
                detokenized.begin(),
                detokenized.end(),
                [](const unsigned char c) { return !std::isprint(c); }),
            detokenized.end());

        buf << "'" << detokenized << "'"
            << ":" << std::to_string(token);
    }

    buf << " ]";

    return buf.str();
}